

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.cpp
# Opt level: O2

char * __thiscall CppUnit::Exception::what(Exception *this)

{
  string *__lhs;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  __lhs = Message::shortDescription_abi_cxx11_(&this->m_message);
  std::operator+(&local_50,__lhs,"\n");
  Message::details_abi_cxx11_(&local_70,&this->m_message);
  std::operator+(&local_30,&local_50,&local_70);
  std::__cxx11::string::operator=((string *)&this->m_whatMessage,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return (this->m_whatMessage)._M_dataplus._M_p;
}

Assistant:

const char*
Exception::what() const throw()
{
  Exception *mutableThis = CPPUNIT_CONST_CAST( Exception *, this );
  mutableThis->m_whatMessage = m_message.shortDescription() + "\n" + 
                               m_message.details();
  return m_whatMessage.c_str();
}